

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_ops_test.cc
# Opt level: O0

void __thiscall
IntegrationTest_TestRsBatchOps_Test::IntegrationTest_TestRsBatchOps_Test
          (IntegrationTest_TestRsBatchOps_Test *this)

{
  IntegrationTest_TestRsBatchOps_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__IntegrationTest_TestRsBatchOps_Test_001ccb00;
  return;
}

Assistant:

TEST(IntegrationTest, TestRsBatchOps)
{
	Qiniu_Client client;
	Qiniu_RS_EntryPath entries[3];
	Qiniu_RS_EntryPathPair entryPairs[3];
	Qiniu_RS_EntryChangeType entriesToChangeType[3];
	Qiniu_RS_EntryRestoreArchive entriesToRestore[3];
	int i;

	Qiniu_Client_InitMacAuth(&client, 1024, NULL);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	for (i = 0; i < 3; i++)
	{
		entryPairs[i].src.bucket = Test_bucket;
		entryPairs[i].dest.bucket = Test_bucket;
		entryPairs[i].src.key = key;
		entryPairs[i].dest.key = copyNames[i];
	}
	batchCopy(&client, entryPairs, 3);

	for (i = 0; i < 3; i++)
	{
		entryPairs[i].src.key = copyNames[i];
		entryPairs[i].dest.key = moveNames[i];
	}
	batchMove(&client, entryPairs, 3);

	for (i = 0; i < 3; i++)
	{
		entries[i].bucket = Test_bucket;
		entries[i].key = moveNames[i];
	}
	batchStat(&client, entries, 3);

	for (i = 0; i < 3; i++)
	{
		entriesToChangeType[i].bucket = Test_bucket;
		entriesToChangeType[i].key = moveNames[i];
		entriesToChangeType[i].fileType = 0;
	}
	batchChangeType(&client, entriesToChangeType, 3);
	for (i = 0; i < 3; i++)
	{
		entriesToChangeType[i].bucket = Test_bucket;
		entriesToChangeType[i].key = moveNames[i];
		entriesToChangeType[i].fileType = 2;
	}
	batchChangeType(&client, entriesToChangeType, 3);

	for (i = 0; i < 3; i++)
	{
		entriesToRestore[i].bucket = Test_bucket;
		entriesToRestore[i].key = moveNames[i];
		entriesToRestore[i].deleteAfterDays = 1;
	}
	batchRestoreArchive(&client, entriesToRestore, 3);

	batchDelete(&client, entries, 3);

	Qiniu_Client_Cleanup(&client);
}